

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::OrthographicCamera::operator==(OrthographicCamera *this,OrthographicCamera *other)

{
  bool bVar1;
  double *in_RSI;
  Value *in_RDI;
  Value *in_stack_ffffffffffffffd8;
  bool local_11;
  
  bVar1 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                           *)in_RDI,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                           *)in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    bVar1 = Value::operator==(in_RDI,in_stack_ffffffffffffffd8);
    local_11 = false;
    if ((((bVar1) && (local_11 = false, ABS(*in_RSI - *(double *)in_RDI) < 1e-12)) &&
        (local_11 = false, ABS(in_RSI[1] - in_RDI->real_value_) < 1e-12)) &&
       (local_11 = false, ABS(in_RSI[2] - *(double *)&in_RDI->string_value_) < 1e-12)) {
      local_11 = ABS(in_RSI[3] - (double)(in_RDI->string_value_)._M_string_length) < 1e-12;
    }
  }
  return local_11;
}

Assistant:

bool OrthographicCamera::operator==(const OrthographicCamera &other) const {
  return this->extensions == other.extensions && this->extras == other.extras &&
         TINYGLTF_DOUBLE_EQUAL(this->xmag, other.xmag) &&
         TINYGLTF_DOUBLE_EQUAL(this->ymag, other.ymag) &&
         TINYGLTF_DOUBLE_EQUAL(this->zfar, other.zfar) &&
         TINYGLTF_DOUBLE_EQUAL(this->znear, other.znear);
}